

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsequentialanimationgroup.cpp
# Opt level: O0

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  QAbstractAnimation *pQVar5;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QBindable<QAbstractAnimation_*> QVar6;
  void *_v;
  QSequentialAnimationGroup *_t;
  QAbstractAnimation *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QSequentialAnimationGroup *in_stack_ffffffffffffff98;
  QSequentialAnimationGroupPrivate *in_stack_ffffffffffffffa0;
  QUntypedPropertyData *local_30;
  QBindableInterface *local_28;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff94 = in_EDX;
    if (in_EDX == 0) {
      currentAnimationChanged((QSequentialAnimationGroup *)0x68b518,in_stack_ffffffffffffff88);
    }
    else if (in_EDX == 1) {
      d_func((QSequentialAnimationGroup *)0x68b524);
      QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished(in_stack_ffffffffffffffa0);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 0) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar4 = QMetaType::fromType<QAbstractAnimation*>();
        **(undefined8 **)in_RCX = QVar4.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QSequentialAnimationGroup::*)(QAbstractAnimation*)>
                        (in_RCX,(void **)currentAnimationChanged,0,0), !bVar2)) {
    if (in_ESI == 6) {
      if (in_EDX == 0) {
        iVar3 = qRegisterMetaType<QAbstractAnimation*>();
        **(int **)in_RCX = iVar3;
      }
      else {
        **(undefined4 **)in_RCX = 0xffffffff;
      }
    }
    if ((in_ESI == 1) &&
       (in_stack_ffffffffffffff98 = *(QSequentialAnimationGroup **)in_RCX, in_EDX == 0)) {
      pQVar5 = currentAnimation((QSequentialAnimationGroup *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      (in_stack_ffffffffffffff98->super_QAnimationGroup).super_QAbstractAnimation.super_QObject.
      _vptr_QObject = (_func_int **)pQVar5;
    }
    if ((in_ESI == 8) && (in_EDX == 0)) {
      QVar6 = bindableCurrentAnimation(in_stack_ffffffffffffff98);
      puVar1 = *(undefined8 **)in_RCX;
      local_30 = QVar6.super_QUntypedBindable.data;
      *puVar1 = local_30;
      local_28 = QVar6.super_QUntypedBindable.iface;
      puVar1[1] = local_28;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSequentialAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentAnimationChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractAnimation* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSequentialAnimationGroup::*)(QAbstractAnimation * )>(_a, &QSequentialAnimationGroup::currentAnimationChanged, 0))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractAnimation* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractAnimation**>(_v) = _t->currentAnimation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentAnimation(); break;
        default: break;
        }
    }
}